

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Function::~Function(Function *this)

{
  size_type sVar1;
  reference ppIVar2;
  reference ppBVar3;
  int local_18;
  int local_14;
  int i_1;
  int i;
  Function *this_local;
  
  this->_vptr_Function = (_func_int **)&PTR__Function_010dd398;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size
                      (&this->parameterInstructions);
    if ((int)sVar1 <= local_14) break;
    ppIVar2 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (&this->parameterInstructions,(long)local_14);
    if (*ppIVar2 != (value_type)0x0) {
      (*(*ppIVar2)->_vptr_Instruction[1])();
    }
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::size(&this->blocks);
    if ((int)sVar1 <= local_18) break;
    ppBVar3 = std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::operator[]
                        (&this->blocks,(long)local_18);
    if (*ppBVar3 != (value_type)0x0) {
      (*(*ppBVar3)->_vptr_Block[1])();
    }
    local_18 = local_18 + 1;
  }
  std::__cxx11::string::~string((string *)&this->exportName);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->reducedPrecisionParams);
  std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::~vector(&this->blocks);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::~vector
            (&this->parameterInstructions);
  spv::Instruction::~Instruction(&this->functionInstruction);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
            (&this->lineInstruction);
  return;
}

Assistant:

virtual ~Function()
    {
        for (int i = 0; i < (int)parameterInstructions.size(); ++i)
            delete parameterInstructions[i];

        for (int i = 0; i < (int)blocks.size(); ++i)
            delete blocks[i];
    }